

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astCompilationUnit *
new_function(Context_conflict *ctx,MOJOSHADER_astFunctionSignature *declaration,
            MOJOSHADER_astStatement *definition)

{
  MOJOSHADER_astCompilationUnitFunction *retval;
  MOJOSHADER_astStatement *definition_local;
  MOJOSHADER_astFunctionSignature *declaration_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x38);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 0x3d;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    ctx_local->malloc_data = (void *)0x0;
    ctx_local->errors = (ErrorList *)declaration;
    ctx_local->warnings = (ErrorList *)definition;
    *(undefined4 *)&ctx_local->strcache = 0;
  }
  return (MOJOSHADER_astCompilationUnit *)ctx_local;
}

Assistant:

static MOJOSHADER_astCompilationUnit *new_function(Context *ctx,
                                MOJOSHADER_astFunctionSignature *declaration,
                                MOJOSHADER_astStatement *definition)
{
    NEW_AST_NODE(retval, MOJOSHADER_astCompilationUnitFunction,
                 MOJOSHADER_AST_COMPUNIT_FUNCTION);
    retval->next = NULL;
    retval->declaration = declaration;
    retval->definition = definition;
    retval->index = 0;
    return (MOJOSHADER_astCompilationUnit *) retval;
}